

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

void __thiscall Poll::loop(Poll *this)

{
  bool bVar1;
  int val;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  uint64_t uVar5;
  pointer ppVar6;
  element_type *this_00;
  _Self __position;
  Error *this_01;
  pointer ppVar7;
  element_type *peVar8;
  bool bVar9;
  Error *e;
  shared_ptr<Subscriber> listener;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false> local_60;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false> local_58;
  iterator listener_itr;
  short sStack_46;
  value_type fd;
  int i;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  uint64_t uStack_18;
  int changed_fds;
  uint64_t time;
  Poll *this_local;
  
  uStack_18 = current_time_millis();
  while( true ) {
    bVar9 = false;
    if ((this->shutdown & 1U) == 0) {
      sVar2 = std::
              unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
              ::size(&this->subs);
      bVar9 = sVar2 != 0;
    }
    if (!bVar9) break;
    sVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::size(&this->fds);
    sVar2 = std::
            unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
            ::size(&this->subs);
    if (sVar2 * 3 < sVar3) {
      compact(this);
    }
    pvVar4 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&this->fds,0);
    sVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::size(&this->fds);
    val = poll((pollfd *)pvVar4,sVar3,100);
    it._M_node._4_4_ = no_err(val,"error in poll");
    if ((it._M_node._4_4_ == 0) || (uVar5 = current_time_millis(), 100 < uVar5 - uStack_18)) {
      uStack_18 = current_time_millis();
      local_28._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<Alarm>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>_>
           ::cbegin(&this->alarms);
      while( true ) {
        local_30._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::shared_ptr<Alarm>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>_>
             ::cend(&this->alarms);
        bVar1 = std::operator!=(&local_28,&local_30);
        bVar9 = false;
        if (bVar1) {
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>
                   ::operator->(&local_28);
          bVar9 = ppVar6->first <= uStack_18;
        }
        if (!bVar9) break;
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>::
                 operator->(&local_28);
        this_00 = std::__shared_ptr_access<Alarm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Alarm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )&ppVar6->second);
        Alarm::on_timeout(this_00);
        __position = std::
                     _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>
                     ::operator++(&local_28,0);
        std::
        map<unsigned_long,_std::shared_ptr<Alarm>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>_>
        ::erase(&this->alarms,(const_iterator)__position._M_node);
      }
    }
    else {
      for (fd.fd = 0; sVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::size(&this->fds),
          (ulong)(long)fd.fd < sVar3; fd.fd = fd.fd + 1) {
        pvVar4 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&this->fds,(long)fd.fd);
        unique0x00012000 = *pvVar4;
        if (sStack_46 != 0) {
          local_58._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
               ::find(&this->subs,
                      (key_type *)
                      ((long)&listener_itr.
                              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>
                              ._M_cur + 4));
          local_60._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
               ::end(&this->subs);
          bVar9 = std::__detail::operator==(&local_58,&local_60);
          if (bVar9) {
            this_01 = (Error *)__cxa_allocate_exception(0x3f0);
            Error::Error(this_01,"No handler for fd %d",(ulong)stack0xffffffffffffffb4 & 0xffffffff)
            ;
            __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
          }
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false,_false>
                                 *)&local_58);
          std::shared_ptr<Subscriber>::shared_ptr((shared_ptr<Subscriber> *)&e,&ppVar7->second);
          if (((ulong)stack0xffffffffffffffb4 & 0x1000000000000) != 0) {
            peVar8 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&e);
            (*peVar8->_vptr_Subscriber[1])(peVar8,this);
          }
          if (((ulong)stack0xffffffffffffffb4 & 0x4000000000000) != 0) {
            peVar8 = std::__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Subscriber,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&e);
            (*peVar8->_vptr_Subscriber[2])(peVar8,this);
          }
          std::shared_ptr<Subscriber>::~shared_ptr((shared_ptr<Subscriber> *)&e);
        }
      }
    }
  }
  return;
}

Assistant:

void Poll::loop() {
  uint64_t time = current_time_millis();
  while (!this->shutdown && this->subs.size() > 0) {
    if (this->fds.size() > COMPACTION_THRESHOLD * this->subs.size())
      compact();
    int changed_fds = no_err(poll(&fds[0], fds.size(), WAIT_QUANTUM), "error in poll");
    if (changed_fds == 0 || current_time_millis() - time > WAIT_QUANTUM) { //Timeout occured
      time = current_time_millis();
      for (auto it = alarms.cbegin(); it != alarms.cend() && it->first <= time;) {
        it->second->on_timeout();
        alarms.erase(it++);
      }
      continue;
    }
    for (int i = 0; i < fds.size(); ++i) {
      auto fd = fds[i];
      if (fd.revents == 0) continue;
      auto listener_itr = this->subs.find(fd.fd);
      if (listener_itr == this->subs.end()) {
        throw Error("No handler for fd %d", fd.fd);
      }
      std::shared_ptr<Subscriber> listener = listener_itr->second;
      try {
        if (fd.revents & POLLIN) {
          listener->on_input(*this);
        }
        if (fd.revents & POLLOUT) {
          listener->on_output(*this);
        }
        if (fd.revents & !(POLLIN | POLLOUT)) {
          std::cout << "Error event from poll " << fd.revents << std::endl;
          listener->on_error(*this, fd.revents);
        }
      } catch (Error &e) {
        printf("Error in event loop %s listener=%s pollfd{ev=%d, fd=%d, revents=%d}\n",
               e.what(), &listener->get_name()[0], fd.events, fd.fd, fd.revents);
      }
    }
  }
}